

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_fragment.cpp
# Opt level: O3

void __thiscall
pstore::exchange::import_ns::fragment_index::fragment_index
          (fragment_index *this,not_null<context_*> ctxt,not_null<transaction_base_*> transaction,
          not_null<const_string_mapping_*> names)

{
  (this->super_rule).context_.ptr_ = ctxt.ptr_;
  (this->super_rule)._vptr_rule = (_func_int **)&PTR__fragment_index_0023bb40;
  (this->transaction_).ptr_ = transaction.ptr_;
  (this->names_).ptr_ = names.ptr_;
  (this->sections_).
  super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sections_).
  super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sections_).
  super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(this->digest_).v_ = 0;
  *(undefined8 *)((long)&(this->digest_).v_ + 8) = 0;
  std::
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ::reserve(&this->sections_,0x13);
  return;
}

Assistant:

fragment_index::fragment_index (not_null<context *> const ctxt,
                                            not_null<transaction_base *> const transaction,
                                            not_null<string_mapping const *> const names)
                    : rule (ctxt)
                    , transaction_{transaction}
                    , names_{names} {
                sections_.reserve (static_cast<std::underlying_type_t<repo::section_kind>> (
                    repo::section_kind::last));
            }